

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arith.hpp
# Opt level: O3

size_t arith_compress(uint8_t *obuff,size_t osize,uint32_t *ibuff,size_t isize)

{
  bool bVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined8 uVar4;
  size_t sVar5;
  uint32_t uVar6;
  ulong uVar7;
  int extraout_EDX;
  int extraout_EDX_00;
  int iVar8;
  ulong uVar9;
  size_t sVar10;
  uint uVar11;
  ulong uVar12;
  long lVar13;
  ulong uVar14;
  size_t __n;
  ulong uVar15;
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 in_ZMM3 [64];
  undefined1 auVar23 [64];
  vector<unsigned_int,_std::allocator<unsigned_int>_> F;
  size_t maxv;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_50;
  size_t local_38;
  undefined1 auVar16 [32];
  
  auVar18 = in_ZMM3._0_32_;
  count_freqs(&local_50,ibuff,isize,&local_38);
  auVar19 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
  auVar23 = ZEXT1664((undefined1  [16])0x0);
  auVar18 = vpcmpeqd_avx2(auVar18,auVar18);
  uVar12 = local_38 + 1;
  auVar20 = vpbroadcastq_avx512f();
  uVar7 = 0;
  do {
    auVar21 = vpbroadcastq_avx512f();
    auVar22 = vmovdqa64_avx512f(auVar23);
    auVar23 = vporq_avx512f(auVar21,auVar19);
    uVar9 = vpcmpuq_avx512f(auVar23,auVar20,2);
    auVar16 = vmovdqu32_avx512vl(*(undefined1 (*) [32])
                                  (local_50.
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_start + uVar7));
    auVar17._4_4_ = (uint)((byte)(uVar9 >> 1) & 1) * auVar16._4_4_;
    auVar17._0_4_ = (uint)((byte)uVar9 & 1) * auVar16._0_4_;
    auVar17._8_4_ = (uint)((byte)(uVar9 >> 2) & 1) * auVar16._8_4_;
    auVar17._12_4_ = (uint)((byte)(uVar9 >> 3) & 1) * auVar16._12_4_;
    auVar17._16_4_ = (uint)((byte)(uVar9 >> 4) & 1) * auVar16._16_4_;
    auVar17._20_4_ = (uint)((byte)(uVar9 >> 5) & 1) * auVar16._20_4_;
    auVar17._24_4_ = (uint)((byte)(uVar9 >> 6) & 1) * auVar16._24_4_;
    auVar17._28_4_ = (uint)(byte)(uVar9 >> 7) * auVar16._28_4_;
    uVar4 = vptestmd_avx512vl(auVar17,auVar17);
    auVar16 = vpsubd_avx2(auVar17,auVar18);
    auVar16 = vmovdqu32_avx512vl(auVar16);
    *(undefined1 (*) [32])
     (local_50.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start + uVar7) = auVar16;
    uVar7 = uVar7 + 8;
    auVar23 = vpmovm2q_avx512dq(uVar4);
    auVar23 = vpsubq_avx512f(auVar22,auVar23);
  } while ((local_38 + (uVar12 == 0) + 8 & 0xfffffffffffffff8) != uVar7);
  auVar19 = vmovdqa64_avx512f(auVar23);
  bVar1 = (bool)((byte)uVar9 & 1);
  auVar20._0_8_ = (ulong)bVar1 * auVar19._0_8_ | (ulong)!bVar1 * auVar22._0_8_;
  bVar1 = (bool)((byte)(uVar9 >> 1) & 1);
  auVar20._8_8_ = (ulong)bVar1 * auVar19._8_8_ | (ulong)!bVar1 * auVar22._8_8_;
  bVar1 = (bool)((byte)(uVar9 >> 2) & 1);
  auVar20._16_8_ = (ulong)bVar1 * auVar19._16_8_ | (ulong)!bVar1 * auVar22._16_8_;
  bVar1 = (bool)((byte)(uVar9 >> 3) & 1);
  auVar20._24_8_ = (ulong)bVar1 * auVar19._24_8_ | (ulong)!bVar1 * auVar22._24_8_;
  bVar1 = (bool)((byte)(uVar9 >> 4) & 1);
  auVar20._32_8_ = (ulong)bVar1 * auVar19._32_8_ | (ulong)!bVar1 * auVar22._32_8_;
  bVar1 = (bool)((byte)(uVar9 >> 5) & 1);
  auVar20._40_8_ = (ulong)bVar1 * auVar19._40_8_ | (ulong)!bVar1 * auVar22._40_8_;
  bVar1 = (bool)((byte)(uVar9 >> 6) & 1);
  auVar20._48_8_ = (ulong)bVar1 * auVar19._48_8_ | (ulong)!bVar1 * auVar22._48_8_;
  auVar20._56_8_ = (uVar9 >> 7) * auVar19._56_8_ | (ulong)!SUB81(uVar9 >> 7,0) * auVar22._56_8_;
  auVar18 = vextracti64x4_avx512f(auVar20,1);
  uVar7 = local_38 - 1;
  lVar13 = 0;
  auVar19 = vpaddq_avx512f(auVar20,ZEXT3264(auVar18));
  auVar2 = vpaddq_avx(auVar19._0_16_,auVar19._16_16_);
  auVar3 = vpshufd_avx(auVar2,0xee);
  auVar2 = vpaddq_avx(auVar2,auVar3);
  do {
    obuff[lVar13] = (uint8_t)uVar7;
    lVar13 = lVar13 + 1;
    uVar7 = uVar7 >> 8;
  } while (lVar13 != 4);
  uVar7 = auVar2._0_8_ - 1;
  lVar13 = 0;
  do {
    obuff[lVar13 + 4] = (uint8_t)uVar7;
    lVar13 = lVar13 + 1;
    uVar7 = uVar7 >> 8;
  } while (lVar13 != 4);
  if (auVar2._0_8_ < 1000) {
    sVar5 = interp_compress(obuff + 8,4,
                            local_50.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_start,uVar12);
    iVar8 = extraout_EDX;
  }
  else {
    sVar5 = arith_compress(obuff + 8,osize - 8,
                           local_50.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                           _M_impl.super__Vector_impl_data._M_start,uVar12);
    iVar8 = extraout_EDX_00;
  }
  scale_counts(&local_50,local_38,iVar8);
  *local_50.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
   super__Vector_impl_data._M_start = 0;
  if (local_38 != 0) {
    uVar6 = *local_50.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar9 = 1;
    uVar7 = 2;
    if (2 < uVar12) {
      uVar7 = uVar12;
    }
    do {
      uVar6 = uVar6 + local_50.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start[uVar9];
      local_50.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start[uVar9] = uVar6;
      uVar9 = uVar9 + 1;
    } while (uVar7 != uVar9);
  }
  sVar5 = sVar5 + 8;
  uVar11 = 0;
  if (isize == 0) {
    uVar12 = 0;
  }
  else {
    bVar1 = true;
    sVar10 = 0;
    uVar12 = 0;
    uVar7 = 0;
    uVar9 = 0xffffffffffffff;
    do {
      uVar14 = uVar9 >> 0x1f;
      lVar13 = uVar14 * local_50.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start[ibuff[sVar10]];
      uVar12 = uVar12 + lVar13;
      uVar9 = uVar9 - lVar13;
      if (-1 < (int)local_50.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start[ibuff[sVar10] + 1]) {
        uVar9 = ((ulong)local_50.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start[ibuff[sVar10] + 1] -
                (ulong)local_50.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_start[ibuff[sVar10]]) * uVar14;
      }
      if (uVar12 < 0x100000000000000) {
        __n = (size_t)uVar11;
      }
      else {
        uVar7 = (ulong)(byte)((char)uVar7 + 1);
        uVar12 = uVar12 & 0xffffffffffffff;
        for (; uVar11 != 0; uVar11 = uVar11 - 1) {
          obuff[sVar5] = (uint8_t)uVar7;
          sVar5 = sVar5 + 1;
          uVar7 = 0;
        }
        __n = 0;
      }
      uVar14 = uVar9;
      if (uVar9 >> 0x30 == 0) {
        do {
          iVar8 = (int)__n;
          if ((~uVar12 & 0xff000000000000) == 0) {
            uVar11 = iVar8 + 1;
          }
          else {
            if (!bVar1) {
              obuff[sVar5] = (uint8_t)uVar7;
              sVar5 = sVar5 + 1;
            }
            uVar7 = uVar12 >> 0x30;
            uVar11 = 0;
            if (iVar8 != 0) {
              memset(obuff + sVar5,0xff,__n);
              sVar5 = sVar5 + 1 + (ulong)(iVar8 - 1);
            }
            bVar1 = false;
          }
          __n = (size_t)uVar11;
          uVar12 = (uVar12 & 0xffffffffffff) << 8;
          uVar9 = uVar14 << 8;
          uVar15 = uVar14 >> 0x28;
          uVar14 = uVar9;
        } while (uVar15 == 0);
      }
      else {
        uVar11 = (uint)__n;
      }
      sVar10 = sVar10 + 1;
    } while (sVar10 != isize);
    if (!bVar1) {
      obuff[sVar5] = (uint8_t)uVar7;
      sVar5 = sVar5 + 1;
    }
    if (uVar11 != 0) {
      memset(obuff + sVar5,0xff,(ulong)uVar11);
      sVar5 = sVar5 + 1 + (ulong)(uVar11 - 1);
    }
  }
  uVar7 = 0x30;
  do {
    uVar9 = uVar7 & 0x3f;
    uVar7 = uVar7 - 8;
    obuff[sVar5] = (uint8_t)(uVar12 >> uVar9);
    sVar5 = sVar5 + 1;
  } while (uVar7 != 0xfffffffffffffff8);
  operator_delete(local_50.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_start,
                  (long)local_50.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage -
                  (long)local_50.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start);
  return sVar5;
}

Assistant:

size_t arith_compress(uint8_t* obuff, /* output buffer */
    size_t osize, /* output buffer size */
    const uint32_t* ibuff, /* input buffer */
    size_t isize)
{ /* input buffer size */

    /* returns the number of bytes written to the output buffer,
           fails/exits if output buffer is too small, provided that
           //myassertion() in enabled */

    /* state variables for encoding */
    uint64_t L = ZERO;
    uint64_t R = FULL;
    uint64_t low, high, total, scale;
    uint32_t v;
    uint8_t last_non_ff_byte = 0, byte;
    uint32_t num_ff_bytes = 0;

    int first = 1;
    size_t op = 0;
    size_t maxv, nunq = 0;

    /* count the frequencies of the provided symbols */
    auto F = count_freqs(ibuff, isize, &maxv);

    /* adjust the counts to allow the interpolative encoder to work */
    for (size_t i = 0; i <= maxv; i++) {
        nunq += (F[i] > 0);
        F[i]++;
    }

    /* now code the prelude into the output buffer */
    op += byte_encode(obuff + op, osize - op, maxv, (1LL << 31));
    op += byte_encode(obuff + op, osize - op, nunq, (1LL << 31));

    if (nunq < PREL_RECURSE) {
        /* small enough that inefficient approach is ok */
        op += interp_compress(obuff + op, osize - op, F.data(), maxv + 1);
    } else {
        /* or else, ta-daa, recursive call for prelude... */
        op += arith_compress(obuff + op, osize - op, F.data(), maxv + 1);
    }

    /* and now scale them up to get total to be a power of two */
    total = scale_counts(F, maxv, 0);

    /* bit ugly to have this next output line coming from here,
           but will do for now */
    /* and turn the adjusted counts in F into cumulative array */
    F[0] = 0;
    for (size_t i = 1; i <= maxv; i++) {
        F[i] = F[i - 1] + F[i];
    }

    /* now encode the array of symbols using the fixed array F to
           control probability estimation, one at a time */
    for (size_t i = 0; i < isize; i++) {
        v = ibuff[i] + 1;

        /* allocated probability range for this symbol */
        low = F[v - 1];
        high = F[v];

        /* this is the actual arithmetic coding step */
        scale = R >> TBTS;
        L += low * scale;
        if (high < total) {
            /* top symbol gets beneit of rounding gaps */
            R = (high - low) * scale;
        } else {
            R = R - low * scale;
        }

        /* now sort out the carry/renormalization process */
        if (L > FULL) {
            /* lower bound has overflowed, need first to push
                           a carry through the ff bytes and into the pending
                           non-ff byte */
            last_non_ff_byte += 1;
            L &= FULL;
            while (num_ff_bytes > 0) {
                obuff[op++] = last_non_ff_byte;
                num_ff_bytes--;
                last_non_ff_byte = ZERO;
            }
        }

        /* more normal type of renorm step */
        while (R < PART) {
            /* can output (or rather, save for later output)
                           a byte from the front of L */
            byte = (L >> (BBITS - 8));
            if (byte != FULLBYTE) {
                /* not ff, so can bring everything up to date */
                if (!first) {
                    obuff[op++] = last_non_ff_byte;
                }
                while (num_ff_bytes) {
                    obuff[op++] = FULLBYTE;
                    num_ff_bytes--;
                }
                last_non_ff_byte = byte;
                first = 0;
            } else {
                /* ff bytes just get counted */
                num_ff_bytes++;
            }
            L <<= 8;
            L &= FULL;
            R <<= 8;
        }
    }

    /* wind up: first flush all of the pending bytes */
    if (!first) {
        obuff[op++] = last_non_ff_byte;
    }
    while (num_ff_bytes) {
        obuff[op++] = FULLBYTE;
        num_ff_bytes--;
    }

    /* then send the final bytes from L, to be sure to be sure */
    for (int i = BBYTES - 1; i >= 0; i--) {
        obuff[op++] = (L >> ((8 * i))) & FULLBYTE;
    }

    /* tidy up, and done */
    return op;
}